

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError secs2ms(long *valp,char *str)

{
  curl_off_t cVar1;
  int iVar2;
  ulong local_70;
  size_t len;
  char *s;
  curl_off_t fracs;
  uint digs [9];
  long ms;
  curl_off_t secs;
  char *str_local;
  long *valp_local;
  
  stack0xffffffffffffffd0 = 0;
  secs = (curl_off_t)str;
  str_local = (char *)valp;
  memcpy(&fracs,&DAT_00134bb0,0x24);
  if ((secs == 0) || (iVar2 = Curl_str_number((char **)&secs,&ms,0x20c49ba5e353f6), iVar2 != 0)) {
    valp_local._4_4_ = PARAM_BAD_NUMERIC;
  }
  else {
    iVar2 = Curl_str_single((char **)&secs,'.');
    cVar1 = secs;
    if (iVar2 == 0) {
      iVar2 = Curl_str_number((char **)&secs,(curl_off_t *)&s,0x7fffffffffffffff);
      if (iVar2 != 0) {
        return PARAM_NUMBER_TOO_LARGE;
      }
      for (local_70 = secs - cVar1; 8 < local_70 || 0x147ae147ae147ae < (long)s;
          local_70 = local_70 - 1) {
        s = (char *)((long)s / 10);
      }
      register0x00000000 = ((long)s * 100) / (long)(ulong)digs[local_70 - 3];
    }
    *(long *)str_local = ms * 1000 + stack0xffffffffffffffd0;
    valp_local._4_4_ = PARAM_OK;
  }
  return valp_local._4_4_;
}

Assistant:

ParameterError secs2ms(long *valp, const char *str)
{
  curl_off_t secs;
  long ms = 0;
  const unsigned int digs[] = { 1, 10, 100, 1000, 10000, 1000000,
    1000000, 10000000, 100000000 };
  if(!str ||
     curlx_str_number(&str, &secs, LONG_MAX/1000 - 1))
    return PARAM_BAD_NUMERIC;
  if(!curlx_str_single(&str, '.')) {
    curl_off_t fracs;
    const char *s = str;
    size_t len;
    if(curlx_str_number(&str, &fracs, CURL_OFF_T_MAX))
      return PARAM_NUMBER_TOO_LARGE;
    /* how many milliseconds are in fracs ? */
    len = (str - s);
    while((len > sizeof(CURL_ARRAYSIZE(digs)) || (fracs > LONG_MAX/100))) {
      fracs /= 10;
      len--;
    }
    ms = ((long)fracs * 100) / digs[len - 1];
  }

  *valp = (long)secs * 1000 + ms;
  return PARAM_OK;
}